

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O0

bool __thiscall
Fossilize::StreamArchive::get_hash_list_for_resource_tag
          (StreamArchive *this,ResourceTag tag,size_t *hash_count,Hash *hashes)

{
  ulong uVar1;
  ExportedMetadataHeader *pEVar2;
  uint64_t uVar3;
  bool bVar4;
  size_type sVar5;
  reference ppVar6;
  pair<const_unsigned_long,_Fossilize::StreamArchive::Entry> *blob;
  iterator __end4;
  iterator __begin4;
  unordered_map<unsigned_long,_Fossilize::StreamArchive::Entry,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Fossilize::StreamArchive::Entry>_>_>
  *__range4;
  Hash *iter;
  size_t size_1;
  size_t i;
  ExportedMetadataBlock *blocks;
  size_t size;
  Hash *hashes_local;
  size_t *hash_count_local;
  ResourceTag tag_local;
  StreamArchive *this_local;
  
  if (this->imported_metadata == (ExportedMetadataHeader *)0x0) {
    sVar5 = std::
            unordered_map<unsigned_long,_Fossilize::StreamArchive::Entry,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Fossilize::StreamArchive::Entry>_>_>
            ::size(this->seen_blobs + tag);
    if (hashes == (Hash *)0x0) {
      *hash_count = sVar5;
    }
    else if (sVar5 != *hash_count) {
      return false;
    }
    if (hashes != (Hash *)0x0) {
      __end4 = std::
               unordered_map<unsigned_long,_Fossilize::StreamArchive::Entry,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Fossilize::StreamArchive::Entry>_>_>
               ::begin(this->seen_blobs + tag);
      blob = (pair<const_unsigned_long,_Fossilize::StreamArchive::Entry> *)
             std::
             unordered_map<unsigned_long,_Fossilize::StreamArchive::Entry,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Fossilize::StreamArchive::Entry>_>_>
             ::end(this->seen_blobs + tag);
      __range4 = (unordered_map<unsigned_long,_Fossilize::StreamArchive::Entry,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Fossilize::StreamArchive::Entry>_>_>
                  *)hashes;
      while (bVar4 = std::__detail::operator!=
                               (&__end4.
                                 super__Node_iterator_base<std::pair<const_unsigned_long,_Fossilize::StreamArchive::Entry>,_false>
                                ,(_Node_iterator_base<std::pair<const_unsigned_long,_Fossilize::StreamArchive::Entry>,_false>
                                  *)&blob), bVar4) {
        ppVar6 = std::__detail::
                 _Node_iterator<std::pair<const_unsigned_long,_Fossilize::StreamArchive::Entry>,_false,_false>
                 ::operator*(&__end4);
        (__range4->_M_h)._M_buckets = (__buckets_ptr)ppVar6->first;
        std::__detail::
        _Node_iterator<std::pair<const_unsigned_long,_Fossilize::StreamArchive::Entry>,_false,_false>
        ::operator++(&__end4);
        __range4 = (unordered_map<unsigned_long,_Fossilize::StreamArchive::Entry,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Fossilize::StreamArchive::Entry>_>_>
                    *)&(__range4->_M_h)._M_bucket_count;
      }
      std::sort<unsigned_long*>(hashes,hashes + sVar5);
    }
  }
  else {
    uVar1 = this->imported_metadata->lists[tag].count;
    if (hashes == (Hash *)0x0) {
      *hash_count = uVar1;
    }
    else if (uVar1 != *hash_count) {
      return false;
    }
    if (hashes != (Hash *)0x0) {
      pEVar2 = this->imported_metadata;
      uVar3 = this->imported_metadata->lists[tag].offset;
      for (size_1 = 0; size_1 < uVar1; size_1 = size_1 + 1) {
        hashes[size_1] = *(Hash *)((long)&pEVar2->lists[size_1 * 2 + -1].offset + uVar3);
      }
    }
  }
  return true;
}

Assistant:

bool get_hash_list_for_resource_tag(ResourceTag tag, size_t *hash_count, Hash *hashes) override
	{
		if (imported_metadata)
		{
			size_t size = imported_metadata->lists[tag].count;
			if (hashes)
			{
				if (size != *hash_count)
					return false;
			}
			else
				*hash_count = size;

			if (hashes)
			{
				const auto *blocks = reinterpret_cast<const ExportedMetadataBlock *>(
						reinterpret_cast<const uint8_t *>(imported_metadata) + imported_metadata->lists[tag].offset);
				for (size_t i = 0; i < size; i++)
					hashes[i] = blocks[i].hash;
			}
		}
		else
		{
			size_t size = seen_blobs[tag].size();
			if (hashes)
			{
				if (size != *hash_count)
					return false;
			}
			else
				*hash_count = size;

			if (hashes)
			{
				Hash *iter = hashes;
				for (auto &blob : seen_blobs[tag])
					*iter++ = blob.first;

				// Make replay more deterministic.
				sort(hashes, hashes + size);
			}
		}

		return true;
	}